

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O0

void __thiscall Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  reference pcVar4;
  TleException *pTVar5;
  bool local_e1;
  bool local_d1;
  bool local_b9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0 [3];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  byte local_79;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  bool done;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  const_iterator i;
  undefined1 local_48 [7];
  bool found_digit;
  string temp;
  double *val_local;
  int point_pos_local;
  string *str_local;
  Tle *this_local;
  
  temp.field_2._8_8_ = val;
  std::__cxx11::string::string((string *)local_48);
  i._M_current._7_1_ = 0;
  local_58._M_current = (char *)std::__cxx11::string::begin();
  do {
    local_60._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) {
      bVar1 = Util::FromString<double>((string *)local_48,(double *)temp.field_2._8_8_);
      if (!bVar1) {
        pTVar5 = (TleException *)__cxa_allocate_exception(0x10);
        TleException::TleException(pTVar5,"Failed to convert value to double");
        __cxa_throw(pTVar5,&TleException::typeinfo,TleException::~TleException);
      }
      std::__cxx11::string::~string((string *)local_48);
      return;
    }
    local_b9 = false;
    if (-1 < point_pos) {
      _Stack_78._M_current = (char *)std::__cxx11::string::begin();
      local_70 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&stack0xffffffffffffff88,(long)point_pos);
      local_68 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator-(&local_70,1);
      local_b9 = __gnu_cxx::operator<(&local_58,&local_68);
    }
    if (local_b9 == false) {
      local_d1 = false;
      if (-1 < point_pos) {
        local_b0._M_current = (char *)std::__cxx11::string::begin();
        local_a8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_b0,(long)point_pos);
        local_a0[0] = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator-(&local_a8,1);
        local_d1 = __gnu_cxx::operator==(&local_58,local_a0);
      }
      if (local_d1 == false) {
        local_b8._M_current = (char *)std::__cxx11::string::begin();
        local_e1 = __gnu_cxx::operator==(&local_58,&local_b8);
        local_e1 = local_e1 && point_pos == -1;
        if (local_e1) {
          std::__cxx11::string::operator+=((string *)local_48,'0');
          std::__cxx11::string::operator+=((string *)local_48,'.');
        }
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        iVar2 = isdigit((int)*pcVar4);
        if (iVar2 == 0) {
          pTVar5 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar5,"Invalid digit");
          __cxa_throw(pTVar5,&TleException::typeinfo,TleException::~TleException);
        }
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        std::__cxx11::string::operator+=((string *)local_48,*pcVar4);
      }
      else {
        lVar3 = std::__cxx11::string::length();
        if (lVar3 == 0) {
          std::__cxx11::string::operator+=((string *)local_48,'0');
        }
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        if (*pcVar4 != '.') {
          pTVar5 = (TleException *)__cxa_allocate_exception(0x10);
          TleException::TleException(pTVar5,"Failed to find decimal point");
          __cxa_throw(pTVar5,&TleException::typeinfo,TleException::~TleException);
        }
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        std::__cxx11::string::operator+=((string *)local_48,*pcVar4);
      }
    }
    else {
      local_79 = 0;
      local_88._M_current = (char *)std::__cxx11::string::begin();
      bVar1 = __gnu_cxx::operator==(&local_58,&local_88);
      if ((bVar1) &&
         ((pcVar4 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_58), *pcVar4 == '-' ||
          (pcVar4 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&local_58), *pcVar4 == '+')))) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        std::__cxx11::string::operator+=((string *)local_48,*pcVar4);
        local_79 = 1;
      }
      if ((local_79 & 1) == 0) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_58);
        iVar2 = isdigit((int)*pcVar4);
        if (iVar2 == 0) {
          if ((i._M_current._7_1_ & 1) != 0) {
            pTVar5 = (TleException *)__cxa_allocate_exception(0x10);
            TleException::TleException(pTVar5,"Unexpected non digit");
            __cxa_throw(pTVar5,&TleException::typeinfo,TleException::~TleException);
          }
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_58);
          if (*pcVar4 != ' ') {
            pTVar5 = (TleException *)__cxa_allocate_exception(0x10);
            TleException::TleException(pTVar5,"Invalid character");
            __cxa_throw(pTVar5,&TleException::typeinfo,TleException::~TleException);
          }
        }
        else {
          i._M_current._7_1_ = 1;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_58);
          std::__cxx11::string::operator+=((string *)local_48,*pcVar4);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}